

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O0

void __thiscall
dynet::PickRange::backward_dev_impl<dynet::Device_CPU>
          (PickRange *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  reference pvVar2;
  DSizes<long,_5> *startIndices;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_1> *this_00;
  ulong uVar3;
  ulong *puVar4;
  Dim *in_RCX;
  TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
  *this_01;
  long in_RDI;
  TensorDevice<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
  TVar5;
  DSizes<long,_5> sizes;
  DSizes<long,_5> indices;
  DefaultDevice *in_stack_fffffffffffffe58;
  long in_stack_fffffffffffffe88;
  long in_stack_fffffffffffffe90;
  long in_stack_fffffffffffffe98;
  DSizes<long,_5> *in_stack_fffffffffffffea0;
  Tensor *in_stack_fffffffffffffec0;
  TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer> *in_stack_ffffffffffffff38;
  
  Eigen::DSizes<long,5>::DSizes<int,int,int>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffe88,
             (int)((ulong)in_RDI >> 0x20));
  this_01 = (TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
             *)(ulong)*(uint *)(in_RDI + 0x60);
  pvVar2 = std::array<long,_5UL>::operator[]
                     ((array<long,_5UL> *)this_01,(size_type)in_stack_fffffffffffffe58);
  *pvVar2 = (value_type_conflict4)this_01;
  uVar1 = Dim::operator[](in_RCX,0);
  startIndices = (DSizes<long,_5> *)(ulong)uVar1;
  uVar1 = Dim::operator[](in_RCX,1);
  this_00 = (TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_1>
             *)(ulong)uVar1;
  uVar1 = Dim::operator[](in_RCX,2);
  uVar3 = (ulong)uVar1;
  Dim::operator[](in_RCX,3);
  Eigen::DSizes<long,5>::DSizes<long,long,long>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88,in_RDI,uVar3);
  uVar3 = (ulong)(uint)(*(int *)(in_RDI + 100) - *(int *)(in_RDI + 0x60));
  puVar4 = (ulong *)std::array<long,_5UL>::operator[]
                              ((array<long,_5UL> *)this_01,(size_type)in_stack_fffffffffffffe58);
  *puVar4 = uVar3;
  Tensor::tb<4>(in_stack_fffffffffffffec0);
  Tensor::tb<4>(in_stack_fffffffffffffec0);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,5,0,long>,0,Eigen::MakePointer>,1>::
  slice<Eigen::DSizes<long,5>,Eigen::DSizes<long,5>>
            (this_00,startIndices,(DSizes<long,_5> *)this_01);
  TVar5 = Eigen::
          TensorBase<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_1>
          ::device<Eigen::DefaultDevice>(this_01,in_stack_fffffffffffffe58);
  Eigen::
  TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,5>const,Eigen::DSizes<long,5>const,Eigen::TensorMap<Eigen::Tensor<float,5,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
  ::operator+=((TensorDevice<Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_5>,_const_Eigen::DSizes<long,_5>,_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::DefaultDevice>
                *)TVar5.m_device,in_stack_ffffffffffffff38);
  return;
}

Assistant:

void PickRange::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  Eigen::DSizes<ptrdiff_t, 5> indices(0,0,0,0,0);
  indices[dim] = start;
  Eigen::DSizes<ptrdiff_t, 5> sizes(static_cast<ptrdiff_t>(fx.d[0]), 
                                    static_cast<ptrdiff_t>(fx.d[1]),
                                    static_cast<ptrdiff_t>(fx.d[2]),
                                    static_cast<ptrdiff_t>(fx.d[3]),
                                    static_cast<ptrdiff_t>(fx.d.bd));
  sizes[dim] = end-start;
  dEdxi.tb<4>().slice(indices, sizes).device(*dev.edevice) += dEdf.tb<4>();
}